

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusBGPlanner.cpp
# Opt level: O0

void __thiscall PerseusBGPlanner::BackupStage(PerseusBGPlanner *this)

{
  QFunctionsDiscrete *in_RDX;
  BeliefSet *in_RSI;
  
  BackupStage(this,in_RSI,in_RDX);
  return;
}

Assistant:

QFunctionsDiscrete
PerseusBGPlanner::BackupStage(const BeliefSet &S,
                              const QFunctionsDiscrete &Q) const
{
    if(_m_computeVectorForEachBelief)
        return(BackupStageAll(S,Q));
    else
    {
#if PerseusBGPlanner_alternativeSampling
        return(BackupStageSamplingAlt(S,Q));
#else
        return(BackupStageSampling(S,Q));
#endif        
    }
}